

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

void __thiscall QPDFJob::doSplitPages(QPDFJob *this,QPDF *pdf)

{
  char *pcVar1;
  element_type *peVar2;
  pointer pQVar3;
  element_type *peVar4;
  element_type *peVar5;
  QPDFDocumentHelper *pQVar6;
  QPDF *qpdf;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  char cVar8;
  bool bVar9;
  int iVar10;
  size_t sVar11;
  char *pcVar12;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pvVar13;
  long *plVar14;
  runtime_error *this_00;
  ulong uVar15;
  QPDFAcroFormDocumentHelper *from_afdh;
  size_type *psVar16;
  void *__buf;
  long i;
  ulong uVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *i_00;
  char cVar18;
  QPDFWriter *pQVar19;
  undefined1 *i_01;
  QPDFAcroFormDocumentHelper *pQVar20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var21;
  QPDFAcroFormDocumentHelper *pQVar22;
  string __str;
  string outfile;
  QPDFWriter w;
  QPDF outpdf;
  QPDFPageLabelDocumentHelper pldh;
  QPDFAcroFormDocumentHelper afdh;
  string after;
  string before;
  QPDFObjectHandle new_page;
  undefined1 local_1f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [24];
  undefined1 local_180 [8];
  QPDFPageDocumentHelper local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_158;
  QPDFAcroFormDocumentHelper local_150;
  QPDFObjectHandle local_130 [2];
  QPDF *local_110;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  QPDFAcroFormDocumentHelper *local_100;
  undefined1 *local_f8;
  char *local_f0;
  undefined1 local_e8;
  undefined7 uStack_e7;
  QPDFObjectHandle local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  QPDFObjectHandle local_88;
  QPDFObjectHandle local_78;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  _Head_base<0UL,_QPDF::Members_*,_false> local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  QPDFJob *local_40;
  QPDFAcroFormDocumentHelper *local_38;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_f8 = &local_e8;
  local_f0 = (char *)0x0;
  local_e8 = 0;
  pcVar1 = (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_110 = pdf;
  sVar11 = strlen(pcVar1);
  pcVar12 = strstr(pcVar1,"%d");
  if (pcVar12 == (char *)0x0) {
    if ((sVar11 < 4) ||
       (iVar10 = QUtil::str_compare_nocase(pcVar1 + (sVar11 - 4),".pdf"), iVar10 != 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,
                 (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  )->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (allocator<char> *)local_1f8);
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_150);
      p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar14 + 2);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar14 == p_Var21) {
        local_178.m.super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)p_Var21->_vptr__Sp_counted_base;
        local_178.m.super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar14[3];
        local_178.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper = (_func_int **)&local_178.m;
      }
      else {
        local_178.m.super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)p_Var21->_vptr__Sp_counted_base;
        local_178.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper = (_func_int **)*plVar14;
      }
      local_178.super_QPDFDocumentHelper.qpdf = (QPDF *)plVar14[1];
      *plVar14 = (long)p_Var21;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_c8,(string *)(local_180 + 8));
      if ((shared_ptr<QPDFPageDocumentHelper::Members> *)
          local_178.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper != &local_178.m) {
        operator_delete(local_178.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper,
                        (ulong)((long)&(local_178.m.
                                        super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->field_0x0 + 1));
      }
      if ((shared_ptr<QPDFAcroFormDocumentHelper::Members> *)
          local_150.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper != &local_150.m) {
        operator_delete(local_150.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper,
                        (ulong)&(local_150.m.
                                 super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->field_0x1);
      }
      goto LAB_00176e2d;
    }
    peVar5 = (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_150.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper = (_func_int **)&local_150.m;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,peVar5,peVar5 + sVar11 + -4);
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_150);
    p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar14 + 2);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar14 == p_Var21) {
      local_178.m.super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)p_Var21->_vptr__Sp_counted_base;
      local_178.m.super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar14[3];
      local_178.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper = (_func_int **)&local_178.m;
    }
    else {
      local_178.m.super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)p_Var21->_vptr__Sp_counted_base;
      local_178.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper = (_func_int **)*plVar14;
    }
    local_178.super_QPDFDocumentHelper.qpdf = (QPDF *)plVar14[1];
    *plVar14 = (long)p_Var21;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_c8,(string *)(local_180 + 8));
    if ((shared_ptr<QPDFPageDocumentHelper::Members> *)
        local_178.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper != &local_178.m) {
      operator_delete(local_178.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper,
                      (ulong)((long)&(local_178.m.
                                      super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->field_0x0 + 1));
    }
    if ((shared_ptr<QPDFAcroFormDocumentHelper::Members> *)
        local_150.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper != &local_150.m) {
      operator_delete(local_150.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper,
                      (ulong)&(local_150.m.
                               super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->field_0x1);
    }
    pcVar12 = (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr + sVar11 + -4
    ;
  }
  else {
    i = (long)pcVar12 - (long)pcVar1;
    if (i < 0) {
      QIntC::IntConverter<long,_unsigned_long,_true,_false>::error(i);
    }
    local_178.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper = (_func_int **)&local_178.m;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_180 + 8),pcVar1,pcVar1 + i);
    std::__cxx11::string::operator=((string *)&local_c8,(string *)(local_180 + 8));
    if ((shared_ptr<QPDFPageDocumentHelper::Members> *)
        local_178.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper != &local_178.m) {
      operator_delete(local_178.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper,
                      (ulong)((long)&(local_178.m.
                                      super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->field_0x0 + 1));
    }
    pcVar12 = pcVar12 + 2;
  }
  pcVar1 = local_f0;
  strlen(pcVar12);
  std::__cxx11::string::_M_replace((ulong)&local_f8,0,pcVar1,(ulong)pcVar12);
LAB_00176e2d:
  bVar9 = shouldRemoveUnreferencedResources(this,local_110);
  qpdf = local_110;
  if (bVar9) {
    QPDFPageDocumentHelper::QPDFPageDocumentHelper
              ((QPDFPageDocumentHelper *)(local_180 + 8),local_110);
    QPDFPageDocumentHelper::removeUnreferencedResources((QPDFPageDocumentHelper *)(local_180 + 8));
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)(local_180 + 8));
  }
  QPDFPageLabelDocumentHelper::QPDFPageLabelDocumentHelper
            ((QPDFPageLabelDocumentHelper *)(local_180 + 8),qpdf);
  QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper(&local_150,qpdf);
  pvVar13 = QPDF::getAllPages(qpdf);
  uVar17 = (long)(pvVar13->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pvVar13->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 4;
  cVar18 = '\x01';
  if (9 < uVar17) {
    uVar15 = uVar17;
    cVar8 = '\x04';
    do {
      cVar18 = cVar8;
      if (uVar15 < 100) {
        cVar18 = cVar18 + -2;
        goto LAB_00176f03;
      }
      if (uVar15 < 1000) {
        cVar18 = cVar18 + -1;
        goto LAB_00176f03;
      }
      if (uVar15 < 10000) goto LAB_00176f03;
      bVar9 = 99999 < uVar15;
      uVar15 = uVar15 / 10000;
      cVar8 = cVar18 + '\x04';
    } while (bVar9);
    cVar18 = cVar18 + '\x01';
  }
LAB_00176f03:
  local_1f8._0_8_ = (QPDFAcroFormDocumentHelper *)(local_1f8 + 0x10);
  std::__cxx11::string::_M_construct((ulong)local_1f8,cVar18);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1f8._0_8_,local_1f8._8_4_,uVar17);
  local_108 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_;
  if ((QPDFAcroFormDocumentHelper *)local_1f8._0_8_ !=
      (QPDFAcroFormDocumentHelper *)(local_1f8 + 0x10)) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
  local_100 = (QPDFAcroFormDocumentHelper *)
              ((long)(pvVar13->
                     super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(pvVar13->
                    super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl
                    .super__Vector_impl_data._M_start);
  if (local_100 != (QPDFAcroFormDocumentHelper *)0x0) {
    local_100 = (QPDFAcroFormDocumentHelper *)((long)local_100 >> 4);
    pQVar22 = (QPDFAcroFormDocumentHelper *)0x0;
    local_40 = this;
    do {
      peVar2 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar10 = peVar2->split_pages;
      if (iVar10 < 0) {
        QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar10);
      }
      from_afdh = (QPDFAcroFormDocumentHelper *)
                  ((long)&(pQVar22->super_QPDFDocumentHelper)._vptr_QPDFDocumentHelper +
                  (long)peVar2->split_pages);
      if (local_100 <= from_afdh) {
        from_afdh = local_100;
      }
      local_158._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)from_afdh;
      QPDF::QPDF((QPDF *)local_180);
      local_198._16_8_ = pQVar22;
      QPDF::emptyPDF((QPDF *)local_180);
      bVar9 = QPDFAcroFormDocumentHelper::hasAcroForm(&local_150);
      if (bVar9) {
        local_1f8._0_8_ = (QPDFAcroFormDocumentHelper *)0x0;
        from_afdh = (QPDFAcroFormDocumentHelper *)local_180;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<QPDFAcroFormDocumentHelper,std::allocator<QPDFAcroFormDocumentHelper>,QPDF&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8 + 8),
                   (QPDFAcroFormDocumentHelper **)local_1f8,
                   (allocator<QPDFAcroFormDocumentHelper> *)&local_1d8,(QPDF *)local_180);
        p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_;
        pQVar22 = (QPDFAcroFormDocumentHelper *)local_1f8._0_8_;
        local_1f8._0_8_ = (QPDFAcroFormDocumentHelper *)0x0;
        local_1f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pQVar22 = (QPDFAcroFormDocumentHelper *)0x0;
      }
      if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          suppress_warnings == true) {
        QPDF::setSuppressWarnings((QPDF *)local_180,true);
      }
      iVar10 = (int)from_afdh;
      local_38 = (QPDFAcroFormDocumentHelper *)(local_198._16_8_ + 1);
      local_1b0 = p_Var21;
      if (local_38 <= local_158._M_pi) {
        uVar17 = local_198._16_8_ << 4 | 8;
        pQVar20 = (QPDFAcroFormDocumentHelper *)local_198._16_8_;
        do {
          pQVar3 = (pvVar13->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((QPDFAcroFormDocumentHelper *)
              ((long)(pvVar13->
                     super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pQVar3 >> 4) <= pQVar20) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       pQVar20);
          }
          peVar4 = *(element_type **)((long)pQVar3 + (uVar17 - 8));
          p_Var21 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     ((long)&(pQVar3->super_BaseHandle).obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> + uVar17);
          if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
            }
            if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
              }
            }
          }
          local_d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = peVar4;
          local_d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = p_Var21;
          QPDF::addPage((QPDF *)local_180,&local_d8,false);
          if (local_d8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_d8.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
            }
          }
          local_68 = peVar4;
          local_60 = p_Var21;
          added_page((QPDF *)&local_58,(QPDFObjectHandle *)local_180);
          if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
          }
          if (pQVar22 != (QPDFAcroFormDocumentHelper *)0x0) {
            local_78.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)local_58._M_head_impl;
            local_78.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = local_50;
            if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_50->_M_use_count = local_50->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_50->_M_use_count = local_50->_M_use_count + 1;
              }
            }
            if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
              }
            }
            from_afdh = &local_150;
            local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar4;
            local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var21;
            QPDFAcroFormDocumentHelper::fixCopiedAnnotations
                      (pQVar22,&local_78,&local_88,from_afdh,
                       (set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)0x0);
            if (local_88.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_88.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            if (local_78.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_78.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
          }
          if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
          }
          if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
          }
          iVar10 = (int)from_afdh;
          pQVar6 = &pQVar20->super_QPDFDocumentHelper;
          uVar17 = uVar17 + 0x10;
          pQVar20 = (QPDFAcroFormDocumentHelper *)
                    ((long)&(pQVar20->super_QPDFDocumentHelper)._vptr_QPDFDocumentHelper + 1);
        } while ((QPDFAcroFormDocumentHelper *)((long)&pQVar6->_vptr_QPDFDocumentHelper + 2) <=
                 local_158._M_pi);
      }
      p_Var21 = local_1b0;
      bVar9 = QPDFPageLabelDocumentHelper::hasPageLabels
                        ((QPDFPageLabelDocumentHelper *)(local_180 + 8));
      this = local_40;
      i_00 = local_108;
      if (bVar9) {
        local_1d8._M_dataplus._M_p = (pointer)0x0;
        local_1d8._M_string_length = 0;
        local_1d8.field_2._M_allocated_capacity = 0;
        if ((long)local_198._16_8_ < 0) {
          QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error(local_198._16_8_);
        }
        i_01 = (undefined1 *)((long)&local_158._M_pi[-1]._M_weak_count + 3);
        if ((long)i_01 < 0) {
          QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error((unsigned_long)i_01);
        }
        iVar10 = 0;
        QPDFPageLabelDocumentHelper::getLabelsForPageRange
                  ((QPDFPageLabelDocumentHelper *)(local_180 + 8),local_198._16_8_,(longlong)i_01,0,
                   (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&local_1d8);
        QPDFObjectHandle::newDictionary();
        local_1f8._0_8_ = local_1f8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"/Nums","");
        i_00 = local_108;
        QPDFObjectHandle::newArray
                  (local_130,
                   (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&local_1d8);
        QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_1a8,(string *)local_1f8,local_130);
        if (local_130[0].super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_130[0].super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if ((QPDFAcroFormDocumentHelper *)local_1f8._0_8_ !=
            (QPDFAcroFormDocumentHelper *)(local_1f8 + 0x10)) {
          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
        }
        QPDF::getRoot((QPDF *)local_130);
        local_1f8._0_8_ = local_1f8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"/PageLabels","");
        QPDFObjectHandle::replaceKey(local_130,(string *)local_1f8,(QPDFObjectHandle *)local_1a8);
        if ((QPDFAcroFormDocumentHelper *)local_1f8._0_8_ !=
            (QPDFAcroFormDocumentHelper *)(local_1f8 + 0x10)) {
          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
        }
        if (local_130[0].super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_130[0].super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
        }
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&local_1d8);
      }
      if ((ulong)i_00 >> 0x1f != 0) {
        QIntC::IntConverter<unsigned_long,_int,_false,_true>::error((unsigned_long)i_00);
      }
      QUtil::uint_to_string_abi_cxx11_
                ((string *)local_1f8,(QUtil *)local_38,(ulong)i_00 & 0xffffffff,iVar10);
      p_Var7 = local_108;
      if (1 < ((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              split_pages) {
        if ((ulong)i_00 >> 0x1f != 0) {
          QIntC::IntConverter<unsigned_long,_int,_false,_true>::error((unsigned_long)local_108);
        }
        QUtil::uint_to_string_abi_cxx11_
                  ((string *)local_1a8,(QUtil *)local_158._M_pi,(ulong)p_Var7 & 0xffffffff,iVar10);
        plVar14 = (long *)std::__cxx11::string::replace((ulong)local_1a8,0,(char *)0x0,0x2648f2);
        psVar16 = (size_type *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_1d8.field_2._M_allocated_capacity = *psVar16;
          local_1d8.field_2._8_8_ = plVar14[3];
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        }
        else {
          local_1d8.field_2._M_allocated_capacity = *psVar16;
          local_1d8._M_dataplus._M_p = (pointer)*plVar14;
        }
        local_1d8._M_string_length = plVar14[1];
        *plVar14 = (long)psVar16;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        std::__cxx11::string::_M_append(local_1f8,(ulong)local_1d8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
          operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
        }
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     &local_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8)
      ;
      plVar14 = (long *)std::__cxx11::string::_M_append((char *)local_1a8,(ulong)local_f8);
      psVar16 = (size_type *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_1d8.field_2._M_allocated_capacity = *psVar16;
        local_1d8.field_2._8_8_ = plVar14[3];
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      }
      else {
        local_1d8.field_2._M_allocated_capacity = *psVar16;
        local_1d8._M_dataplus._M_p = (pointer)*plVar14;
      }
      local_1d8._M_string_length = plVar14[1];
      *plVar14 = (long)psVar16;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
        operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
      }
      bVar9 = QUtil::same_file((((this->m).
                                 super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->infilename).
                               super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                               local_1d8._M_dataplus._M_p);
      if (bVar9) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,"split pages would overwrite input file with ",&local_1d8);
        std::runtime_error::runtime_error(this_00,(string *)local_1a8);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      QPDFWriter::QPDFWriter((QPDFWriter *)local_1a8,(QPDF *)local_180,local_1d8._M_dataplus._M_p);
      pQVar19 = (QPDFWriter *)local_1a8;
      setWriterOptions(this,(QPDFWriter *)local_1a8);
      QPDFWriter::write((QPDFWriter *)local_1a8,(int)pQVar19,__buf,(size_t)psVar16);
      local_a8._8_8_ = 0;
      local_a8._M_unused._M_object = &local_1d8;
      pcStack_90 = std::
                   _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:3074:21)>
                   ::_M_invoke;
      local_98 = std::
                 _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:3074:21)>
                 ::_M_manager;
      doIfVerbose(this,(function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_a8);
      if (local_98 != (code *)0x0) {
        (*local_98)(&local_a8,&local_a8,__destroy_functor);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((QPDFAcroFormDocumentHelper *)local_1f8._0_8_ !=
          (QPDFAcroFormDocumentHelper *)(local_1f8 + 0x10)) {
        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
      }
      if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
      }
      QPDF::~QPDF((QPDF *)local_180);
      peVar2 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar10 = peVar2->split_pages;
      if (iVar10 < 0) {
        QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar10);
      }
      pQVar22 = (QPDFAcroFormDocumentHelper *)(local_198._16_8_ + (long)peVar2->split_pages);
    } while (pQVar22 < local_100);
  }
  QPDFAcroFormDocumentHelper::~QPDFAcroFormDocumentHelper(&local_150);
  QPDFPageLabelDocumentHelper::~QPDFPageLabelDocumentHelper
            ((QPDFPageLabelDocumentHelper *)(local_180 + 8));
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,CONCAT71(uStack_e7,local_e8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void
QPDFJob::doSplitPages(QPDF& pdf)
{
    // Generate output file pattern
    std::string before;
    std::string after;
    size_t len = strlen(m->outfilename.get());
    char* num_spot = strstr(const_cast<char*>(m->outfilename.get()), "%d");
    if (num_spot != nullptr) {
        QTC::TC("qpdf", "QPDFJob split-pages %d");
        before = std::string(m->outfilename.get(), QIntC::to_size(num_spot - m->outfilename.get()));
        after = num_spot + 2;
    } else if (
        (len >= 4) && (QUtil::str_compare_nocase(m->outfilename.get() + len - 4, ".pdf") == 0)) {
        QTC::TC("qpdf", "QPDFJob split-pages .pdf");
        before = std::string(m->outfilename.get(), len - 4) + "-";
        after = m->outfilename.get() + len - 4;
    } else {
        QTC::TC("qpdf", "QPDFJob split-pages other");
        before = std::string(m->outfilename.get()) + "-";
    }

    if (shouldRemoveUnreferencedResources(pdf)) {
        QPDFPageDocumentHelper dh(pdf);
        dh.removeUnreferencedResources();
    }
    QPDFPageLabelDocumentHelper pldh(pdf);
    QPDFAcroFormDocumentHelper afdh(pdf);
    std::vector<QPDFObjectHandle> const& pages = pdf.getAllPages();
    size_t pageno_len = std::to_string(pages.size()).length();
    size_t num_pages = pages.size();
    for (size_t i = 0; i < num_pages; i += QIntC::to_size(m->split_pages)) {
        size_t first = i + 1;
        size_t last = i + QIntC::to_size(m->split_pages);
        if (last > num_pages) {
            last = num_pages;
        }
        QPDF outpdf;
        outpdf.emptyPDF();
        std::shared_ptr<QPDFAcroFormDocumentHelper> out_afdh;
        if (afdh.hasAcroForm()) {
            out_afdh = std::make_shared<QPDFAcroFormDocumentHelper>(outpdf);
        }
        if (m->suppress_warnings) {
            outpdf.setSuppressWarnings(true);
        }
        for (size_t pageno = first; pageno <= last; ++pageno) {
            QPDFObjectHandle page = pages.at(pageno - 1);
            outpdf.addPage(page, false);
            auto new_page = added_page(outpdf, page);
            if (out_afdh.get()) {
                QTC::TC("qpdf", "QPDFJob copy form fields in split_pages");
                try {
                    out_afdh->fixCopiedAnnotations(new_page, page, afdh);
                } catch (std::exception& e) {
                    pdf.warn(
                        qpdf_e_damaged_pdf,
                        "",
                        0,
                        ("Exception caught while fixing copied annotations. This may be a qpdf "
                         "bug." +
                         std::string("Exception: ") + e.what()));
                }
            }
        }
        if (pldh.hasPageLabels()) {
            std::vector<QPDFObjectHandle> labels;
            pldh.getLabelsForPageRange(
                QIntC::to_longlong(first - 1), QIntC::to_longlong(last - 1), 0, labels);
            QPDFObjectHandle page_labels = QPDFObjectHandle::newDictionary();
            page_labels.replaceKey("/Nums", QPDFObjectHandle::newArray(labels));
            outpdf.getRoot().replaceKey("/PageLabels", page_labels);
        }
        std::string page_range = QUtil::uint_to_string(first, QIntC::to_int(pageno_len));
        if (m->split_pages > 1) {
            page_range += "-" + QUtil::uint_to_string(last, QIntC::to_int(pageno_len));
        }
        std::string outfile = before + page_range + after;
        if (QUtil::same_file(m->infilename.get(), outfile.c_str())) {
            throw std::runtime_error("split pages would overwrite input file with " + outfile);
        }
        QPDFWriter w(outpdf, outfile.c_str());
        setWriterOptions(w);
        w.write();
        doIfVerbose([&](Pipeline& v, std::string const& prefix) {
            v << prefix << ": wrote file " << outfile << "\n";
        });
    }
}